

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O3

base_learner * gd_mf_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  uint64_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  gdmf *pgVar6;
  typed_option<unsigned_long> *ptVar7;
  uint64_t uVar8;
  learner<gdmf,_example> *plVar9;
  vw_exception *pvVar10;
  uint32_t *puVar11;
  byte bVar12;
  uint stride_shift;
  float fVar13;
  bool conjugate_gradient;
  bool bfgs;
  option_group_definition gf_md_options;
  stringstream __msg;
  bool local_322;
  bool local_321;
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  free_ptr<gdmf> local_300;
  option_group_definition local_2f0;
  undefined1 local_2b8 [48];
  string local_288 [64];
  bool local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pgVar6 = calloc_or_throw<gdmf>(1);
  pgVar6->all = (vw *)0x0;
  (pgVar6->scalars)._begin = (float *)0x0;
  (pgVar6->scalars)._end = (float *)0x0;
  (pgVar6->scalars).end_array = (float *)0x0;
  (pgVar6->scalars).erase_count = 0;
  *(undefined8 *)&pgVar6->rank = 0;
  pgVar6->no_win_counter = 0;
  pgVar6->early_stop_thres = 0;
  local_300._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<gdmf>;
  local_321 = false;
  local_322 = false;
  local_300._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>._M_head_impl
       = pgVar6;
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"Gradient Descent Matrix Factorization","");
  local_2f0.m_name._M_dataplus._M_p = (pointer)&local_2f0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2f0,local_130,local_130 + local_128);
  local_2f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"rank","");
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_2b8,&local_d0,&pgVar6->rank);
  local_248 = true;
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"rank for matrix factorization.","");
  std::__cxx11::string::_M_assign(local_288);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_2f0,(typed_option<unsigned_int> *)local_2b8);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0]);
  }
  local_2b8._0_8_ = &PTR__typed_option_002da278;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_pi);
  }
  if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"bfgs","");
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_2b8,&local_f0,&local_321)
  ;
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"Option not supported by this reduction","");
  std::__cxx11::string::_M_assign(local_288);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_2f0,(typed_option<bool> *)local_2b8);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0]);
  }
  local_2b8._0_8_ = &PTR__typed_option_002da130;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_pi);
  }
  if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"conjugate_gradient","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b8,&local_110,&local_322);
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,"Option not supported by this reduction","");
  std::__cxx11::string::_M_assign(local_288);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_2f0,(typed_option<bool> *)local_2b8);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0]);
  }
  local_2b8._0_8_ = &PTR__typed_option_002da130;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_pi);
  }
  if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_2f0);
  pp_Var1 = (_func_int **)(local_2b8 + 0x10);
  local_2b8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"rank","");
  iVar5 = (*options->_vptr_options_i[1])(options,local_2b8);
  if ((_func_int **)local_2b8._0_8_ != pp_Var1) {
    operator_delete((void *)local_2b8._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar9 = (learner<gdmf,_example> *)0x0;
  }
  else {
    local_2b8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"adaptive","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_2b8);
    if ((_func_int **)local_2b8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_2b8 + 0x10),
                 "adaptive is not implemented for matrix factorization",0x34);
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15b,&local_50);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_2b8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"normalized","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_2b8);
    if ((_func_int **)local_2b8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_2b8 + 0x10),
                 "normalized is not implemented for matrix factorization",0x36);
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15d,&local_70);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_2b8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"exact_adaptive_norm","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_2b8);
    if ((_func_int **)local_2b8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_2b8 + 0x10),
                 "normalized adaptive updates is not implemented for matrix factorization",0x47);
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15f,&local_90);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if ((local_321 != false) || (local_322 == true)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_2b8 + 0x10),"bfgs is not implemented for matrix factorization",
                 0x30);
      pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x162,&local_b0);
      __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    pgVar6->all = all;
    pgVar6->no_win_counter = 0;
    fVar13 = logf((float)(pgVar6->rank * 2 + 1));
    fVar13 = ceilf(fVar13 / 0.6931472);
    stride_shift = (uint)(long)fVar13 |
                   (uint)(long)(fVar13 - 9.223372e+18) & (uint)((long)fVar13 >> 0x3f);
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,stride_shift);
    }
    else {
      (all->weights).dense_weights._stride_shift = stride_shift;
    }
    all->random_weights = true;
    if (all->holdout_set_off == false) {
      all->sd->holdout_best_loss = 3.4028234663852886e+38;
      local_2b8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"early_terminate","");
      ptVar7 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)local_2b8);
      puVar2 = (ptVar7->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (puVar2 == (uint64_t *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *puVar2;
      }
      pgVar6->early_stop_thres = uVar8;
      if ((_func_int **)local_2b8._0_8_ != pp_Var1) {
        operator_delete((void *)local_2b8._0_8_);
      }
    }
    local_2b8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"learning_rate","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_2b8);
    if ((char)iVar5 == '\0') {
      local_320[0] = local_310;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"l","");
      iVar5 = (*options->_vptr_options_i[1])(options,local_320);
      if (local_320[0] != local_310) {
        operator_delete(local_320[0]);
      }
      bVar12 = (byte)iVar5 ^ 1;
    }
    else {
      bVar12 = 0;
    }
    if ((_func_int **)local_2b8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if (bVar12 != 0) {
      all->eta = 10.0;
    }
    local_2b8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"initial_t","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_2b8);
    if ((_func_int **)local_2b8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if ((char)iVar5 == '\0') {
      all->sd->t = 1.0;
      all->initial_t = 1.0;
    }
    fVar13 = powf((float)all->sd->t,all->power_t);
    all->eta = fVar13 * all->eta;
    puVar11 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar11 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar9 = LEARNER::init_learner<gdmf,example,LEARNER::learner<char,example>>
                       (&local_300,learn,predict,1L << ((byte)*puVar11 & 0x3f));
    *(code **)(plVar9 + 0x80) = save_load;
    uVar3 = *(undefined8 *)(plVar9 + 0x18);
    uVar4 = *(undefined8 *)(plVar9 + 0x20);
    *(undefined8 *)(plVar9 + 0x70) = uVar3;
    *(undefined8 *)(plVar9 + 0x78) = uVar4;
    *(undefined8 *)(plVar9 + 0x88) = uVar3;
    *(undefined8 *)(plVar9 + 0x90) = uVar4;
    *(code **)(plVar9 + 0x98) = end_pass;
    *(undefined8 *)(plVar9 + 0xb8) = uVar3;
    *(undefined8 *)(plVar9 + 0xc0) = uVar4;
    *(code **)(plVar9 + 200) = finish;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_2f0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_name._M_dataplus._M_p != &local_2f0.m_name.field_2) {
    operator_delete(local_2f0.m_name._M_dataplus._M_p);
  }
  if (local_300._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
      _M_head_impl != (gdmf *)0x0) {
    (*(code *)local_300._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_300._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>
               ._M_head_impl);
  }
  return (base_learner *)plVar9;
}

Assistant:

base_learner* gd_mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<gdmf>();

  bool bfgs = false;
  bool conjugate_gradient = false;
  option_group_definition gf_md_options("Gradient Descent Matrix Factorization");
  gf_md_options.add(make_option("rank", data->rank).keep().help("rank for matrix factorization."));

  // Not supported, need to be checked to be false.
  gf_md_options.add(make_option("bfgs", bfgs).help("Option not supported by this reduction"));
  gf_md_options.add(
      make_option("conjugate_gradient", conjugate_gradient).help("Option not supported by this reduction"));
  options.add_and_parse(gf_md_options);

  if (!options.was_supplied("rank"))
    return nullptr;

  if (options.was_supplied("adaptive"))
    THROW("adaptive is not implemented for matrix factorization");
  if (options.was_supplied("normalized"))
    THROW("normalized is not implemented for matrix factorization");
  if (options.was_supplied("exact_adaptive_norm"))
    THROW("normalized adaptive updates is not implemented for matrix factorization");

  if (bfgs || conjugate_gradient)
    THROW("bfgs is not implemented for matrix factorization");

  data->all = &all;
  data->no_win_counter = 0;

  // store linear + 2*rank weights per index, round up to power of two
  float temp = ceilf(logf((float)(data->rank * 2 + 1)) / logf(2.f));
  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    data->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (!options.was_supplied("learning_rate") && !options.was_supplied("l"))
    all.eta = 10;  // default learning rate to 10 for non default update rule

  // default initial_t to 1 instead of 0
  if (!options.was_supplied("initial_t"))
  {
    all.sd->t = 1.f;
    all.initial_t = 1.f;
  }
  all.eta *= powf((float)(all.sd->t), all.power_t);

  learner<gdmf, example>& l = init_learner(data, learn, predict, (UINT64_ONE << all.weights.stride_shift()));
  l.set_save_load(save_load);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}